

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::Write
          (TextGenerator *this,char *data,size_t size)

{
  int iVar1;
  void *void_buffer;
  char *local_30;
  
  if ((size != 0) && (this->failed_ == false)) {
    if (this->at_start_of_line_ == true) {
      this->at_start_of_line_ = false;
      WriteIndent(this);
      if (this->failed_ != false) {
        return;
      }
    }
    while( true ) {
      iVar1 = this->buffer_size_;
      if ((long)size <= (long)iVar1) break;
      if (0 < iVar1) {
        memcpy(this->buffer_,data,(long)iVar1);
        data = data + this->buffer_size_;
        size = size - (long)this->buffer_size_;
      }
      local_30 = (char *)0x0;
      iVar1 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                        (this->output_,&local_30,&this->buffer_size_);
      this->failed_ = (bool)((byte)iVar1 ^ 1);
      if ((byte)iVar1 == 0) {
        return;
      }
      this->buffer_ = local_30;
    }
    memcpy(this->buffer_,data,size);
    this->buffer_ = this->buffer_ + size;
    this->buffer_size_ = this->buffer_size_ - (int)size;
  }
  return;
}

Assistant:

void Write(const char* data, size_t size) {
    if (failed_) return;
    if (size == 0) return;

    if (at_start_of_line_) {
      // Insert an indent.
      at_start_of_line_ = false;
      WriteIndent();
      if (failed_) return;
    }

    while (static_cast<int64_t>(size) > buffer_size_) {
      // Data exceeds space in the buffer.  Copy what we can and request a
      // new buffer.
      if (buffer_size_ > 0) {
        memcpy(buffer_, data, buffer_size_);
        data += buffer_size_;
        size -= buffer_size_;
      }
      void* void_buffer = nullptr;
      failed_ = !output_->Next(&void_buffer, &buffer_size_);
      if (failed_) return;
      buffer_ = reinterpret_cast<char*>(void_buffer);
    }

    // Buffer is big enough to receive the data; copy it.
    memcpy(buffer_, data, size);
    buffer_ += size;
    buffer_size_ -= size;
  }